

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

parser_error parse_chest_trap_dice(parser *p)

{
  _Bool _Var1;
  void *pvVar2;
  dice_t *dice_00;
  char *string_00;
  char *string;
  effect *effect;
  dice_t *dice;
  chest_trap *t;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  string = *(char **)((long)pvVar2 + 0x20);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (string == (char *)0x0) {
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  else {
    for (; *(long *)string != 0; string = *(char **)string) {
    }
    dice_00 = dice_new();
    if (dice_00 == (dice_t *)0x0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_DICE;
    }
    else {
      string_00 = parser_getstr(p,"dice");
      _Var1 = dice_parse_string(dice_00,string_00);
      if (_Var1) {
        *(dice_t **)(string + 0x10) = dice_00;
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
      else {
        dice_free(dice_00);
        p_local._4_4_ = PARSE_ERROR_INVALID_DICE;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_chest_trap_dice(struct parser *p) {
	struct chest_trap *t = parser_priv(p);
	dice_t *dice = NULL;
	struct effect *effect = t->effect;
	const char *string = NULL;

	if (!t)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	/* If there is no effect, assume that this is human and not parser error. */
	if (effect == NULL)
		return PARSE_ERROR_NONE;

	while (effect->next) effect = effect->next;

	dice = dice_new();

	if (dice == NULL)
		return PARSE_ERROR_INVALID_DICE;

	string = parser_getstr(p, "dice");

	if (dice_parse_string(dice, string)) {
		effect->dice = dice;
	}
	else {
		dice_free(dice);
		return PARSE_ERROR_INVALID_DICE;
	}

	return PARSE_ERROR_NONE;
}